

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_convert_int.c
# Opt level: O1

int mpt_data_convert_int64(int64_t *from,mpt_type_t type,void *dest)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  iovec *vec;
  int iVar4;
  ulong uVar5;
  
  if (from == (int64_t *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *from;
  }
  if (type == 0x6c) {
    cVar1 = mpt_type_int(8);
    type = (mpt_type_t)cVar1;
  }
  iVar2 = -3;
  iVar4 = (int)uVar5;
  switch(type) {
  case 0x62:
    if ((long)(char)uVar5 != uVar5) {
      return -2;
    }
    goto LAB_0010faed;
  case 99:
    ppuVar3 = __ctype_b_loc();
    if (-1 < (short)(*ppuVar3)[iVar4]) {
      return -2;
    }
    goto LAB_0010faed;
  case 100:
    iVar2 = 8;
    if (dest != (void *)0x0) {
      *(double *)dest = (double)(long)uVar5;
    }
    break;
  case 0x65:
    iVar2 = 0x10;
    if (dest != (void *)0x0) {
      *(longdouble *)dest = (longdouble)(long)uVar5;
    }
    break;
  case 0x66:
    iVar2 = 4;
    if (dest != (void *)0x0) {
      *(float *)dest = (float)(long)uVar5;
    }
    break;
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6f:
  case 0x70:
  case 0x72:
  case 0x73:
  case 0x76:
  case 0x77:
    break;
  case 0x69:
    if ((long)iVar4 != uVar5) {
      return -2;
    }
    goto LAB_0010fb09;
  case 0x6e:
    if ((long)(short)uVar5 != uVar5) {
      return -2;
    }
    goto LAB_0010fb26;
  case 0x71:
    if (0xffff < uVar5) {
      return -2;
    }
LAB_0010fb26:
    iVar2 = 2;
    if (dest != (void *)0x0) {
      *(short *)dest = (short)uVar5;
    }
    break;
  case 0x74:
    if ((long)uVar5 < 0) {
      return -2;
    }
  case 0x78:
    iVar2 = 8;
    if (dest != (void *)0x0) {
      *(ulong *)dest = uVar5;
    }
    break;
  case 0x75:
    if (uVar5 >> 0x20 != 0) {
      return -2;
    }
LAB_0010fb09:
    iVar2 = 4;
    if (dest != (void *)0x0) {
      *(int *)dest = iVar4;
    }
    break;
  case 0x79:
    if (0xff < uVar5) {
      return -2;
    }
LAB_0010faed:
    iVar2 = 1;
    if (dest != (void *)0x0) {
      *(char *)dest = (char)uVar5;
    }
    break;
  default:
    if (type == 0x58) {
      if (dest == (void *)0x0) {
        iVar2 = -0x10;
      }
      else {
        *(int64_t **)dest = from;
        *(undefined8 *)((long)dest + 8) = 8;
        iVar2 = 0x10;
      }
    }
  }
  return iVar2;
}

Assistant:

extern int mpt_data_convert_int64(const int64_t *from, MPT_TYPE(type) type, void *dest)
{
	int64_t val = 0;
	if (from) {
		val = *from;
	}
	if (type == 'l') {
		type = mpt_type_int(sizeof(long));
	}
	switch (type) {
		case 'c':
			if (!isgraph(val)) return MPT_ERROR(BadValue);
			if (dest) *((char *) dest) = val;
			return sizeof(char);
		case 'b':
			if (val < INT8_MIN || val > INT8_MAX) return MPT_ERROR(BadValue);
			if (dest) *((int8_t *) dest) = val;
			return sizeof(int8_t);
		case 'y':
			if (val < 0 || val > UINT8_MAX) return MPT_ERROR(BadValue);
			if (dest) *((uint8_t *) dest) = val;
			return sizeof(uint8_t);
		case 'n':
			if (val < INT16_MIN || val > INT16_MAX) return MPT_ERROR(BadValue);
			if (dest) *((int16_t *) dest) = val;
			return sizeof(int16_t);
		case 'q':
			if (val < 0 || val > UINT16_MAX) return MPT_ERROR(BadValue);
			if (dest) *((uint16_t *) dest) = val;
			return sizeof(uint16_t);
		case 'i':
			if (val < INT32_MIN || val > INT32_MAX) return MPT_ERROR(BadValue);
			if (dest) *((int32_t *) dest) = val;
			return sizeof(int32_t);
		case 'u':
			if (val < 0 || val > UINT32_MAX) return MPT_ERROR(BadValue);
			if (dest) *((uint32_t *) dest) = val;
			return sizeof(uint32_t);
		case 't':
			if (val < 0) return MPT_ERROR(BadValue);
			/* fall through */
		case 'x':
			if (dest) *((int64_t *) dest) = val;
			return sizeof(int64_t);
		
		case 'f':
			if (dest) *((float *) dest) = val;
			return sizeof(float);
		case 'd':
			if (dest) *((double *) dest) = val;
			return sizeof(double);
#ifdef _MPT_FLOAT_EXTENDED_H
		case 'e':
			if (dest) *((long double *) dest) = val;
			return sizeof(long double);
#endif
		case MPT_type_toVector('x'):
			if (dest) {
				struct iovec *vec = dest;
				vec->iov_base = (void *) from;
				vec->iov_len  = sizeof(*from);
				return sizeof(*vec);
			}
			return MPT_ERROR(MissingData);
		default:
			/* invalid conversion */
			return MPT_ERROR(BadType);
	}
}